

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

void __thiscall
GenericModelPrivate::encodeMime(GenericModelPrivate *this,QMimeData *data,QModelIndexList *indexes)

{
  Entry ancestor;
  Span *pSVar1;
  piter it;
  undefined1 it_00 [16];
  bool bVar2;
  GenericModelItem *pGVar3;
  ulong uVar4;
  type item;
  long lVar5;
  QModelIndex *idx;
  QModelIndex *this_00;
  QSet<GenericModelItem_*> itemsToSave;
  QDataStream stream;
  ulong uStack_80;
  QByteArray encoded;
  iterator i;
  
  itemsToSave.q_hash.d = (Hash)(Data *)0x0;
  this_00 = (indexes->d).ptr;
  for (lVar5 = (indexes->d).size * 0x18; lVar5 != 0; lVar5 = lVar5 + -0x18) {
    bVar2 = QModelIndex::isValid(this_00);
    if (bVar2) {
      pGVar3 = itemForIndex(this,this_00);
      _stream = (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)pGVar3;
      QSet<GenericModelItem_*>::operator<<(&itemsToSave,(GenericModelItem **)&stream);
    }
    this_00 = this_00 + 1;
  }
  _stream = (piter)QHash<GenericModelItem_*,_QHashDummyValue>::begin(&itemsToSave.q_hash);
LAB_0012f463:
  do {
    if ((stream._0_8_ == (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) &&
       (stream._8_8_ == 0)) {
      encoded.d._0_16_ = ZEXT816(0);
      encoded.d.size = 0;
      QDataStream::QDataStream(&stream,&encoded,2);
      if (itemsToSave.q_hash.d == (Data *)0x0) {
        item = (type)0x0;
      }
      else {
        item._4_4_ = 0;
        item._0_4_ = *(uint *)((long)itemsToSave.q_hash.d + 8);
      }
      QDataStream::operator<<(&stream,item._0_4_);
      i.i = QHash<GenericModelItem_*,_QHashDummyValue>::begin(&itemsToSave.q_hash);
      while( true ) {
        if (i.i.i.d == (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0 &&
            i.i.i.bucket == 0) break;
        pSVar1 = (i.i.i.d)->spans;
        uVar4 = i.i.i.bucket >> 7;
        item = pSVar1[uVar4].entries[pSVar1[uVar4].offsets[(uint)i.i.i.bucket & 0x7f]].storage;
        ::operator<<(&stream,(GenericModelItem *)item);
        QHashPrivate::iterator<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_>::operator++
                  ((iterator<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)&i);
      }
      mimeDataName((QString *)&i,(GenericModelPrivate *)item);
      QMimeData::setData((QString *)data,(QByteArray *)&i);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&i);
      QDataStream::~QDataStream(&stream);
      QArrayDataPointer<char>::~QArrayDataPointer(&encoded.d);
      QHash<GenericModelItem_*,_QHashDummyValue>::~QHash(&itemsToSave.q_hash);
      return;
    }
    encoded.d.d = (Data *)_stream;
    encoded.d.ptr = (char *)uStack_80;
    do {
      QHashPrivate::iterator<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_>::operator++
                ((iterator<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)&encoded);
      while( true ) {
        it_00 = (undefined1  [16])encoded.d._0_16_;
        it = _stream;
        if (encoded.d.d == (Data *)0x0 && encoded.d.ptr == (char *)0x0) {
          QHashPrivate::iterator<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_>::
          operator++((iterator<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)&stream);
          goto LAB_0012f463;
        }
        ancestor.storage =
             _stream->spans[uStack_80 >> 7].entries
             [_stream->spans[uStack_80 >> 7].offsets[stream._8_4_ & 0x7f]].storage;
        lVar5 = ((ulong)encoded.d.ptr >> 7) * 0x90;
        pGVar3 = *(GenericModelItem **)
                  (*(long *)(*(long *)&encoded.d.d[2].super_QArrayData + 0x80 + lVar5) +
                  (ulong)*(byte *)((ulong)((uint)encoded.d.ptr & 0x7f) +
                                  *(long *)&encoded.d.d[2].super_QArrayData + lVar5) * 8);
        bVar2 = GenericModelItem::isAnchestor((GenericModelItem *)ancestor.storage,pGVar3);
        if (!bVar2) break;
        encoded.d._0_16_ =
             QHash<GenericModelItem_*,_QHashDummyValue>::erase
                       (&itemsToSave.q_hash,(const_iterator)it_00);
      }
      bVar2 = GenericModelItem::isAnchestor(pGVar3,(GenericModelItem *)ancestor.storage);
    } while (!bVar2);
    _stream = (piter)QHash<GenericModelItem_*,_QHashDummyValue>::erase
                               (&itemsToSave.q_hash,(const_iterator)it);
  } while( true );
}

Assistant:

void GenericModelPrivate::encodeMime(QMimeData *data, const QModelIndexList &indexes) const
{
    Q_ASSERT(data);
    Q_Q(const GenericModel);
    QSet<GenericModelItem *> itemsToSave;
    for (auto &&idx : indexes) {
        if (!idx.isValid())
            continue;
        Q_ASSERT(idx.model() == q);
        itemsToSave << itemForIndex(idx);
    }
    for (auto i = itemsToSave.begin(); i != itemsToSave.end();) {
        bool iToErase = false;
        auto j = i;
        for (++j; j != itemsToSave.end();) {
            if (GenericModelItem::isAnchestor(*i, *j)) {
                j = itemsToSave.erase(j);
                continue;
            }
            if (GenericModelItem::isAnchestor(*j, *i)) {
                iToErase = true;
                break;
            }
            ++j;
        }
        if (iToErase)
            i = itemsToSave.erase(i);
        else
            ++i;
    }
    QByteArray encoded;
    QDataStream stream(&encoded, QIODevice::WriteOnly);
    stream << qint32(itemsToSave.size());
    for (auto i = itemsToSave.begin(); i != itemsToSave.end(); ++i)
        stream << **i;
    data->setData(mimeDataName(), encoded);
}